

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O1

Promise<int> __thiscall
kj::Timer::timeoutAfter<int>(Timer *this,Duration delay,Promise<int> *promise)

{
  PromiseArenaMember *node;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> node_00;
  _func_int **pp_Var1;
  OwnPromiseNode *in_RCX;
  PromiseArenaMember *local_50;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_48;
  _func_int **local_40;
  SourceLocation local_38;
  
  (**(code **)(*delay.value + 0x10))((anon_class_1_0_00000001_for_func *)&local_50);
  Promise<void>::
  then<kj::Timer::timeoutAfter<int>(kj::Quantity<long,kj::_::NanosecondLabel>,kj::Promise<int>&&)::_lambda()_1_>
            ((Promise<void> *)&local_48,(anon_class_1_0_00000001_for_func *)&local_50);
  local_38.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/timer.h";
  local_38.function = "timeoutAfter";
  local_38.lineNumber = 0x9b;
  local_38.columnNumber = 10;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)&local_40,in_RCX,&local_48,&local_38);
  pp_Var1 = local_40;
  node_00.ptr = local_48.ptr;
  local_40 = (_func_int **)0x0;
  (this->super_MonotonicClock)._vptr_MonotonicClock = pp_Var1;
  if (&(local_48.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
  }
  node = local_50;
  if (local_50 != (PromiseArenaMember *)0x0) {
    local_50 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Timer::timeoutAfter(Duration delay, Promise<T>&& promise) {
  return promise.exclusiveJoin(afterDelay(delay).then([]() -> kj::Promise<T> {
    return makeTimeoutException();
  }));
}